

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O0

void __thiscall gnuplotio::GnuplotTmpfile::GnuplotTmpfile(GnuplotTmpfile *this,bool _debug_messages)

{
  ostream *os;
  basic_ostream<char,_std::char_traits<char>_> *this_00;
  path local_78;
  path local_58;
  path local_38;
  byte local_11;
  GnuplotTmpfile *pGStack_10;
  bool _debug_messages_local;
  GnuplotTmpfile *this_local;
  
  local_11 = _debug_messages;
  pGStack_10 = this;
  boost::filesystem::temp_directory_path();
  boost::filesystem::path::path(&local_78,"tmp-gnuplot-%%%%-%%%%-%%%%-%%%%");
  boost::filesystem::operator/(&local_38,&local_58,&local_78);
  boost::filesystem::unique_path(&this->file,&local_38);
  boost::filesystem::path::~path(&local_38);
  boost::filesystem::path::~path(&local_78);
  boost::filesystem::path::~path(&local_58);
  this->debug_messages = (bool)(local_11 & 1);
  if ((this->debug_messages & 1U) != 0) {
    os = std::operator<<((ostream *)&std::cerr,"create tmpfile ");
    this_00 = boost::filesystem::operator<<(os,&this->file);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

explicit GnuplotTmpfile(bool _debug_messages) :
        file(boost::filesystem::unique_path(
            boost::filesystem::temp_directory_path() /
            "tmp-gnuplot-%%%%-%%%%-%%%%-%%%%")),
        debug_messages(_debug_messages)
    {
        if(debug_messages) {
            std::cerr << "create tmpfile " << file << std::endl;
        }
    }